

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_delete_char_left(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  Fl_Input *this_local;
  
  iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
  if (iVar1 == 0) {
    iVar1 = Fl_Input_::mark(&this->super_Fl_Input_);
    iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
    if (iVar1 == iVar2) {
      Fl_Input_::cut(&this->super_Fl_Input_,-1);
    }
    else {
      Fl_Input_::cut(&this->super_Fl_Input_);
    }
  }
  else {
    fl_beep(0);
  }
  return 1;
}

Assistant:

int Fl_Input::kf_delete_char_left() {
  if (readonly()) { fl_beep(); return 1; }
  if (mark() != position()) cut();
  else cut(-1);
  return 1;
}